

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmHexFileConverter.cxx
# Opt level: O2

bool cmHexFileConverter::TryConvert(string *inFileName,string *outFileName)

{
  bool bVar1;
  bool bVar2;
  FileType FVar3;
  uint uVar4;
  FILE *__stream;
  FILE *__stream_00;
  char *pcVar5;
  uint startIndex;
  char buf [1024];
  
  FVar3 = DetermineFileType(inFileName);
  if (FVar3 != Binary) {
    __stream = (FILE *)cmsys::SystemTools::Fopen(inFileName,"rb");
    __stream_00 = (FILE *)cmsys::SystemTools::Fopen(outFileName,"wb");
    if (__stream != (FILE *)0x0 && __stream_00 != (FILE *)0x0) {
      bVar1 = false;
switchD_00263558_caseD_35:
      while (bVar2 = bVar1, pcVar5 = fgets(buf,0x400,__stream), pcVar5 != (char *)0x0) {
        uVar4 = ChompStrlen(buf);
        if (FVar3 == MotorolaSrec) {
          bVar2 = false;
          if (((uVar4 - 10 < 0x205) && ((uVar4 & 1) == 0)) && (buf[0] == 'S'))
          goto code_r0x00263530;
          break;
        }
        bVar2 = false;
        if (((0x200 < uVar4 - 0xb) || ((uVar4 & 1) == 0)) || ((buf[0] != ':' || (buf[7] != '0'))))
        break;
        bVar1 = true;
        if (3 < (byte)buf[8] - 0x32) {
          if ((byte)buf[8] - 0x30 < 2) {
            startIndex = 9;
            goto LAB_002635b5;
          }
          goto LAB_002635c4;
        }
      }
      goto switchD_00263558_caseD_34;
    }
    if (__stream != (FILE *)0x0) {
      fclose(__stream);
    }
    if (__stream_00 != (FILE *)0x0) {
      fclose(__stream_00);
    }
  }
  return false;
code_r0x00263530:
  bVar2 = false;
  startIndex = 8;
  bVar1 = true;
  switch(buf[1]) {
  case '1':
    break;
  case '2':
    startIndex = 10;
    break;
  case '3':
    startIndex = 0xc;
    break;
  default:
    goto switchD_00263558_caseD_34;
  case '5':
  case '7':
  case '8':
  case '9':
    goto switchD_00263558_caseD_35;
  }
LAB_002635b5:
  bVar2 = OutputBin((FILE *)__stream_00,buf,startIndex,uVar4 - 2);
  bVar1 = true;
  if (!bVar2) {
LAB_002635c4:
    bVar2 = false;
    goto switchD_00263558_caseD_34;
  }
  goto switchD_00263558_caseD_35;
switchD_00263558_caseD_34:
  fclose(__stream);
  fclose(__stream_00);
  return bVar2;
}

Assistant:

bool cmHexFileConverter::TryConvert(const std::string& inFileName,
                                    const std::string& outFileName)
{
  FileType type = DetermineFileType(inFileName);
  if (type == Binary) {
    return false;
  }

  // try to open the file
  FILE* inFile = cmsys::SystemTools::Fopen(inFileName, "rb");
  FILE* outFile = cmsys::SystemTools::Fopen(outFileName, "wb");
  if ((inFile == nullptr) || (outFile == nullptr)) {
    if (inFile != nullptr) {
      fclose(inFile);
    }
    if (outFile != nullptr) {
      fclose(outFile);
    }
    return false;
  }

  // convert them line by line
  bool success = false;
  char buf[1024];
  while (fgets(buf, 1024, inFile) != nullptr) {
    if (type == MotorolaSrec) {
      success = ConvertMotorolaSrecLine(buf, outFile);
    } else if (type == IntelHex) {
      success = ConvertIntelHexLine(buf, outFile);
    }
    if (!success) {
      break;
    }
  }

  // close them again
  fclose(inFile);
  fclose(outFile);
  return success;
}